

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  cmake *pcVar1;
  pointer ppcVar2;
  pointer pGVar3;
  bool bVar4;
  string *psVar5;
  cmMakefile *pcVar6;
  pointer ppcVar7;
  ostream *poVar8;
  char **log;
  cmMakefile *mf;
  undefined **ppuVar9;
  string f;
  cmMakefile *dirMf;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  globalTargets;
  cmStateSnapshot snapshot;
  char num [100];
  
  this->FirstTimeProgress = 0.0;
  ClearGeneratorMembers(this);
  pcVar1 = this->CMakeInstance;
  snapshot.Position.Position = (pcVar1->CurrentSnapshot).Position.Position;
  snapshot.State = (pcVar1->CurrentSnapshot).State;
  snapshot.Position.Tree = (pcVar1->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&globalTargets,&snapshot);
  psVar5 = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)&globalTargets,psVar5);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&globalTargets,&snapshot);
  psVar5 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&globalTargets,psVar5);
  pcVar6 = (cmMakefile *)operator_new(0x7e8);
  cmMakefile::cmMakefile(pcVar6,this,&snapshot);
  dirMf = pcVar6;
  cmMakefile::SetRecursionDepth(pcVar6,this->RecursionDepth);
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back(&this->Makefiles,&dirMf);
  IndexMakefile(this,dirMf);
  psVar5 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->BinaryDirectories,psVar5);
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmMakefile::Configure(dirMf);
  cmMakefile::EnforceDirectoryLevelRules(dirMf);
  this->ConfigureDoneCMP0026AndCMP0024 = true;
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CreateDefaultGlobalTargets(this,&globalTargets);
  ppcVar2 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar7 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pGVar3 = globalTargets.
               super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish, ppcVar7 != ppcVar2; ppcVar7 = ppcVar7 + 1
      ) {
    pcVar6 = *ppcVar7;
    for (mf = (cmMakefile *)
              globalTargets.
              super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
              ._M_impl.super__Vector_impl_data._M_start; mf != (cmMakefile *)pGVar3;
        mf = (cmMakefile *)&(mf->Targets)._M_h._M_element_count) {
      CreateGlobalTarget((cmGlobalGenerator *)num,(GlobalTargetInfo *)this,mf);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string_const&,cmTarget>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pcVar6->Targets,mf,(cmGlobalGenerator *)num);
      cmTarget::~cmTarget((cmTarget *)num);
    }
  }
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::~vector(&globalTargets);
  sprintf(num,"%d",(ulong)((long)(this->Makefiles).
                                 super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->Makefiles).
                                super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
  pcVar1 = this->CMakeInstance;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&globalTargets,"CMAKE_NUMBER_OF_MAKEFILES",(allocator<char> *)&f);
  cmake::AddCacheEntry(pcVar1,(string *)&globalTargets,num,"number of local generators",4);
  std::__cxx11::string::~string((string *)&globalTargets);
  CheckTargetProperties(this);
  if (this->CMakeInstance->CurrentWorkingMode == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&globalTargets);
    bVar4 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar4) {
      std::operator<<((ostream *)&globalTargets,"Configuring incomplete, errors occurred!");
      for (ppuVar9 = &PTR_anon_var_dwarf_190c30_005dbe40; *ppuVar9 != (undefined *)0x0;
          ppuVar9 = ppuVar9 + 1) {
        psVar5 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
        std::__cxx11::string::string((string *)&f,(string *)psVar5);
        std::__cxx11::string::append((char *)&f);
        std::__cxx11::string::append((char *)&f);
        std::__cxx11::string::append((char *)&f);
        bVar4 = cmsys::SystemTools::FileExists(&f);
        if (bVar4) {
          poVar8 = std::operator<<((ostream *)&globalTargets,"\nSee also \"");
          poVar8 = std::operator<<(poVar8,(string *)&f);
          std::operator<<(poVar8,"\".");
        }
        std::__cxx11::string::~string((string *)&f);
      }
    }
    else {
      std::operator<<((ostream *)&globalTargets,"Configuring done");
    }
    pcVar1 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::UpdateProgress(pcVar1,&f,-1.0);
    std::__cxx11::string::~string((string *)&f);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&globalTargets);
  }
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();

  cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();

  snapshot.GetDirectory().SetCurrentSource(
    this->CMakeInstance->GetHomeDirectory());
  snapshot.GetDirectory().SetCurrentBinary(
    this->CMakeInstance->GetHomeOutputDirectory());

  cmMakefile* dirMf = new cmMakefile(this, snapshot);
  dirMf->SetRecursionDepth(this->RecursionDepth);
  this->Makefiles.push_back(dirMf);
  this->IndexMakefile(dirMf);

  this->BinaryDirectories.insert(
    this->CMakeInstance->GetHomeOutputDirectory());

  // now do it
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  dirMf->Configure();
  dirMf->EnforceDirectoryLevelRules();

  this->ConfigureDoneCMP0026AndCMP0024 = true;

  // Put a copy of each global target in every directory.
  {
    std::vector<GlobalTargetInfo> globalTargets;
    this->CreateDefaultGlobalTargets(globalTargets);

    for (cmMakefile* mf : this->Makefiles) {
      auto& targets = mf->GetTargets();
      for (GlobalTargetInfo const& globalTarget : globalTargets) {
        targets.emplace(globalTarget.Name,
                        this->CreateGlobalTarget(globalTarget, mf));
      }
    }
  }

  // update the cache entry for the number of local generators, this is used
  // for progress
  char num[100];
  sprintf(num, "%d", static_cast<int>(this->Makefiles.size()));
  this->GetCMakeInstance()->AddCacheEntry("CMAKE_NUMBER_OF_MAKEFILES", num,
                                          "number of local generators",
                                          cmStateEnums::INTERNAL);

  // check for link libraries and include directories containing "NOTFOUND"
  // and for infinite loops
  this->CheckTargetProperties();

  if (this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE) {
    std::ostringstream msg;
    if (cmSystemTools::GetErrorOccuredFlag()) {
      msg << "Configuring incomplete, errors occurred!";
      const char* logs[] = { "CMakeOutput.log", "CMakeError.log", nullptr };
      for (const char** log = logs; *log; ++log) {
        std::string f = this->CMakeInstance->GetHomeOutputDirectory();
        f += "/CMakeFiles";
        f += "/";
        f += *log;
        if (cmSystemTools::FileExists(f)) {
          msg << "\nSee also \"" << f << "\".";
        }
      }
    } else {
      msg << "Configuring done";
    }
    this->CMakeInstance->UpdateProgress(msg.str(), -1);
  }
}